

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O3

Result __thiscall wabt::SharedValidator::OnMemoryCopy(SharedValidator *this,Location *loc)

{
  Result RVar1;
  Result RVar2;
  Var local_60;
  
  this->expr_loc_ = loc;
  Var::Var(&local_60,0,loc);
  RVar1 = CheckMemoryIndex(this,&local_60,(MemoryType *)0x0);
  Var::~Var(&local_60);
  RVar2 = TypeChecker::OnMemoryCopy(&this->typechecker_);
  RVar1.enum_._0_1_ = RVar2.enum_ == Error || RVar1.enum_ == Error;
  RVar1.enum_._1_3_ = 0;
  return (Result)RVar1.enum_;
}

Assistant:

Result SharedValidator::OnMemoryCopy(const Location& loc) {
  Result result = Result::Ok;
  expr_loc_ = &loc;
  result |= CheckMemoryIndex(Var(0, loc));
  result |= typechecker_.OnMemoryCopy();
  return result;
}